

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Testing2_640x480at60_25.175MHz_Dice.c
# Opt level: O0

int main(void)

{
  undefined4 local_1c;
  undefined4 local_18;
  int j_3;
  int j_2;
  int j_1;
  int j;
  
  line = 0;
  for (j_2 = 0; j_2 < 0x1e0; j_2 = j_2 + 1) {
    displayLine();
  }
  for (j_3 = 0; j_3 < 10; j_3 = j_3 + 1) {
    blankingTime();
  }
  for (local_18 = 0; local_18 < 2; local_18 = local_18 + 1) {
    vSyncLine();
  }
  for (local_1c = 0; local_1c < 0x20; local_1c = local_1c + 1) {
    blankingTime();
  }
  lastBlankingTime();
  return 0;
}

Assistant:

int main() {

    line = 0;

    // Display Scan Lines
    for(int j=0;j<480;j++) {
        displayLine();
    }

    // Front Porch Scan Lines
    for(int j=0;j<10;j++) {
        blankingTime();
    }

    // vSync Scan Lines
    for(int j=0;j<2;j++) {
        vSyncLine();
    }

    // Back Porch Scan Lines
    for(int j=0;j<32;j++) {
        blankingTime();
    }

    // Last Blanking Scan Line
    lastBlankingTime();

    return 0;
}